

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O3

void __thiscall
glslang::TInfoSinkBase::location
          (TInfoSinkBase *this,TSourceLoc *loc,bool absolute,bool displayColumn)

{
  undefined7 in_register_00000009;
  string location;
  char locText [24];
  string local_d8;
  char local_b8 [32];
  path local_98;
  path local_70;
  TPersistString local_48;
  
  if ((int)CONCAT71(in_register_00000009,displayColumn) == 0) {
    snprintf(local_b8,0x18,":%d",(ulong)(uint)loc->line);
  }
  else {
    snprintf(local_b8,0x18,":%d:%d",(ulong)(uint)loc->line,(ulong)(uint)loc->column);
  }
  if (((loc->name == (TString *)0x0) || ((loc->name->_M_dataplus)._M_p == (pointer)0x0)) &&
     (absolute && this->shaderFileName != (char *)0x0)) {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_98,&this->shaderFileName,auto_format);
    std::filesystem::absolute(&local_70);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,local_70._M_pathname._M_dataplus._M_p,
               local_70._M_pathname._M_dataplus._M_p + local_70._M_pathname._M_string_length);
    append(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_70);
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  else {
    TSourceLoc::getStringNameOrNum_abi_cxx11_(&local_d8,loc,false);
    if (absolute) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_98,&local_d8,auto_format);
      std::filesystem::absolute(&local_70);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,local_70._M_pathname._M_dataplus._M_p,
                 local_70._M_pathname._M_dataplus._M_p + local_70._M_pathname._M_string_length);
      append(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_70);
      std::filesystem::__cxx11::path::~path(&local_98);
    }
    else {
      append(this,&local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  append(this,local_b8);
  append(this,": ");
  return;
}

Assistant:

void location(const TSourceLoc& loc, bool absolute = false, bool displayColumn = false) {
        const int maxSize = 24;
        char locText[maxSize];
        if (displayColumn) {
            snprintf(locText, maxSize, ":%d:%d", loc.line, loc.column);
        } else {
            snprintf(locText, maxSize, ":%d", loc.line);
        }

        if(loc.getFilename() == nullptr && shaderFileName != nullptr && absolute) {
            append(std::filesystem::absolute(shaderFileName).string());
        } else {
            std::string location = loc.getStringNameOrNum(false);
            if (absolute) {
                append(std::filesystem::absolute(location).string());
            } else {
                append(location);
            }
        }

        append(locText);
        append(": ");
    }